

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxc.cxx
# Opt level: O0

bool __thiscall ExchCXX::detail::LibxcKernelImpl::is_hyb_(LibxcKernelImpl *this)

{
  bool local_9;
  LibxcKernelImpl *this_local;
  
  local_9 = true;
  if ((((this->kernel_).info)->family != 0x20) &&
     (local_9 = true, ((this->kernel_).info)->family != 0x40)) {
    local_9 = ((this->kernel_).info)->family == 0x80;
  }
  return local_9;
}

Assistant:

bool LibxcKernelImpl::is_hyb_() const noexcept {
  return
    (kernel_.info->family == XC_FAMILY_HYB_GGA ) or
    (kernel_.info->family == XC_FAMILY_HYB_MGGA)
#if XC_MAJOR_VERSION > 6
    or (kernel_.info->family == XC_FAMILY_HYB_LDA)
#endif
  ;
}